

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O0

pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>,_bool>
* __thiscall
phmap::priv::anon_unknown_0::
unique_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
::insert(pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>,_bool>
         *__return_storage_ptr__,
        unique_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
        *this,value_type *x)

{
  bool bVar1;
  reference x_00;
  reference y;
  char *pcVar2;
  pair<std::_Rb_tree_iterator<std::pair<const_long,_long>_>,_bool> pVar3;
  AssertHelper local_d0;
  Message local_c8;
  unsigned_long local_c0;
  size_type local_b8;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_2;
  Message local_98;
  size_type local_90;
  size_type local_88;
  undefined1 local_80 [8];
  AssertionResult gtest_ar_1;
  Message local_58;
  undefined1 local_50 [8];
  AssertionResult gtest_ar;
  _Rb_tree_iterator<std::pair<const_long,_long>_> local_30;
  pair<std::_Rb_tree_iterator<std::pair<const_long,_long>_>,_bool> checker_res;
  size_t size;
  value_type *x_local;
  unique_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
  *this_local;
  
  checker_res._8_8_ =
       btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
       ::size((btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
               *)this);
  pVar3 = std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
          insert(&(this->
                  super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                  ).checker_,x);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )pVar3.first._M_node;
  checker_res.first._M_node._0_1_ = pVar3.second;
  local_30._M_node =
       (_Base_ptr)
       gtest_ar.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
  ::insert(__return_storage_ptr__,
           (btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
            *)this,x);
  x_00 = btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>
         ::operator*(&__return_storage_ptr__->first);
  y = std::_Rb_tree_iterator<std::pair<const_long,_long>_>::operator*(&local_30);
  (anonymous_namespace)::CheckPairEquals<long_const,long,long_const,long>(x_00,y);
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_50,"tree_res.second","checker_res.second",
             &__return_storage_ptr__->second,(bool *)&checker_res);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar1) {
    testing::Message::Message(&local_58);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_50);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x160,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  local_88 = btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
             ::size((btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                     *)this);
  local_90 = std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
             size(&(this->
                   super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                   ).checker_);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_80,"this->tree_.size()","this->checker_.size()",&local_88,&local_90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x161,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  local_b8 = btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
             ::size((btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                     *)this);
  local_c0 = checker_res._8_8_ + (ulong)(__return_storage_ptr__->second & 1);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_b0,"this->tree_.size()","size + tree_res.second",&local_b8,&local_c0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x162,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d0,&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    testing::Message::~Message(&local_c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> insert(const value_type &x) {
            size_t size = this->tree_.size();
            std::pair<typename CheckerType::iterator, bool> checker_res =
                this->checker_.insert(x);
            std::pair<iterator, bool> tree_res = this->tree_.insert(x);
            CheckPairEquals(*tree_res.first, *checker_res.first);
            EXPECT_EQ(tree_res.second, checker_res.second);
            EXPECT_EQ(this->tree_.size(), this->checker_.size());
            EXPECT_EQ(this->tree_.size(), size + tree_res.second);
            return tree_res;
        }